

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easy.c
# Opt level: O2

CURLcode curl_easy_ssls_import
                   (CURL *d,char *session_key,uchar *shmac,size_t shmac_len,uchar *sdata,
                   size_t sdata_len)

{
  return CURLE_NOT_BUILT_IN;
}

Assistant:

CURLcode curl_easy_ssls_import(CURL *d, const char *session_key,
                               const unsigned char *shmac, size_t shmac_len,
                               const unsigned char *sdata, size_t sdata_len)
{
#ifdef USE_SSLS_EXPORT
  struct Curl_easy *data = d;
  if(!GOOD_EASY_HANDLE(data))
    return CURLE_BAD_FUNCTION_ARGUMENT;
  return Curl_ssl_session_import(data, session_key,
                                 shmac, shmac_len, sdata, sdata_len);
#else
  (void)d;
  (void)session_key;
  (void)shmac;
  (void)shmac_len;
  (void)sdata;
  (void)sdata_len;
  return CURLE_NOT_BUILT_IN;
#endif
}